

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# istring.hpp
# Opt level: O3

bool tao::pegtl::internal::
     istring<(char)83,(char)101,(char)103,(char)109,(char)101,(char)110,(char)116>::
     match<tao::pegtl::file_input<(tao::pegtl::tracking_mode)0,tao::pegtl::ascii::eol::lf_crlf>>
               (file_input<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf> *in)

{
  iterator_t *piVar1;
  size_t *psVar2;
  byte *pbVar3;
  bool bVar4;
  
  pbVar3 = (byte *)(in->
                   super_mmap_input<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf>).
                   super_memory_input<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_const_char_*>
                   .
                   super_memory_input_base<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_const_char_*>
                   .m_current.data;
  if ((((6 < (ulong)((long)(in->
                           super_mmap_input<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf>
                           ).
                           super_memory_input<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_const_char_*>
                           .
                           super_memory_input_base<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_const_char_*>
                           .m_end - (long)pbVar3)) && ((*pbVar3 & 0xdf) == 0x53)) &&
      ((pbVar3[1] & 0xdf) == 0x45)) &&
     (bVar4 = istring_equal<'g',_'m',_'e',_'n',_'t'>::match((char *)(pbVar3 + 2)), bVar4)) {
    piVar1 = &(in->super_mmap_input<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf>).
              super_memory_input<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_const_char_*>
              .
              super_memory_input_base<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_const_char_*>
              .m_current;
    piVar1->data = piVar1->data + 7;
    psVar2 = &(in->super_mmap_input<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf>).
              super_memory_input<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_const_char_*>
              .
              super_memory_input_base<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_const_char_*>
              .m_current.byte;
    *psVar2 = *psVar2 + 7;
    psVar2 = &(in->super_mmap_input<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf>).
              super_memory_input<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_const_char_*>
              .
              super_memory_input_base<(tao::pegtl::tracking_mode)0,_tao::pegtl::ascii::eol::lf_crlf,_const_char_*>
              .m_current.byte_in_line;
    *psVar2 = *psVar2 + 7;
    return true;
  }
  return false;
}

Assistant:

static bool match( Input& in ) noexcept( noexcept( in.size( 0 ) ) )
            {
               if( in.size( sizeof...( Cs ) ) >= sizeof...( Cs ) ) {
                  if( istring_equal< Cs... >::match( in.current() ) ) {
                     bump_help< result_on_found::success, Input, char, Cs... >( in, sizeof...( Cs ) );
                     return true;
                  }
               }
               return false;
            }